

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O3

void __thiscall
HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
::~HighsHashTable(HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                  *this)

{
  u64 uVar1;
  void *pvVar2;
  _Head_base<0UL,_HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>_*,_false>
  _Var3;
  pointer *__ptr;
  uchar *puVar4;
  long lVar5;
  long lVar6;
  
  puVar4 = (this->metadata)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if (puVar4 != (uchar *)0x0) {
    uVar1 = this->tableSizeMask;
    if (uVar1 != 0xffffffffffffffff) {
      lVar6 = 0;
      lVar5 = 0;
      do {
        if (((char)(this->metadata)._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl[lVar5] < '\0') &&
           (pvVar2 = *(void **)((long)&((this->entries)._M_t.
                                        super___uniq_ptr_impl<HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>,_HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>::OpNewDeleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>_*,_HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>::OpNewDeleter>
                                        .
                                        super__Head_base<0UL,_HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>_*,_false>
                                       ._M_head_impl)->value_ + lVar6), pvVar2 != (void *)0x0)) {
          operator_delete(pvVar2);
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x18;
      } while (uVar1 + 1 != lVar5);
      puVar4 = (this->metadata)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      if (puVar4 == (uchar *)0x0) goto LAB_002c759f;
    }
    operator_delete__(puVar4);
  }
LAB_002c759f:
  (this->metadata)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  _Var3._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>,_HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>_*,_HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>::OpNewDeleter>
       .
       super__Head_base<0UL,_HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>_*,_false>
       ._M_head_impl;
  if (_Var3._M_head_impl !=
      (HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
       *)0x0) {
    operator_delete(_Var3._M_head_impl);
  }
  (this->entries)._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>,_HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>::OpNewDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>_*,_HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>::OpNewDeleter>
  .
  super__Head_base<0UL,_HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>_*,_false>
  ._M_head_impl =
       (HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
        *)0x0;
  return;
}

Assistant:

~HighsHashTable() {
    if (!std::is_trivially_destructible<Entry>::value && metadata) {
      u64 capacity = tableSizeMask + 1;
      for (u64 i = 0; i < capacity; ++i) {
        if (occupied(metadata[i])) entries.get()[i].~Entry();
      }
    }
  }